

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Equation_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
::eval_internal(Equation_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                *this,Dispatch_State *t_ss)

{
  uint uVar1;
  Opers t_oper;
  Type_Conversions *pTVar2;
  long lVar3;
  Boxed_Value *pBVar4;
  bool bVar5;
  eval_error *peVar6;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar7;
  string_view t_name;
  string_view t_name_00;
  array<chaiscript::Boxed_Value,_2UL> params;
  Function_Push_Pop fpp;
  string local_d0;
  Dispatch_State local_b0;
  undefined1 local_90 [40];
  Boxed_Value local_68;
  Boxed_Value local_50;
  Boxed_Value local_40;
  
  detail::Function_Push_Pop::Function_Push_Pop((Function_Push_Pop *)local_90,in_RDX);
  local_d0._M_dataplus._M_p = (pointer)t_ss;
  local_d0._M_string_length = (size_type)in_RDX;
  eval_internal::anon_class_16_2_3fe617c6::operator()
            ((array<chaiscript::Boxed_Value,_2UL> *)&local_b0,(anon_class_16_2_3fe617c6 *)&local_d0)
  ;
  if (((local_b0.m_engine._M_data)->m_conversions).m_mutex._M_impl._M_rwlock.__size[1] == '\x01') {
    peVar6 = (eval_error *)__cxa_allocate_exception(0x90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"Error, cannot assign to temporary value.",
               (allocator<char> *)(local_90 + 8));
    exception::eval_error::eval_error(peVar6,&local_d0);
    __cxa_throw(peVar6,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  uVar1 = ((local_b0.m_engine._M_data)->m_mutex)._M_impl._M_rwlock.__data.__pad3;
  if ((uVar1 & 1) != 0) {
    peVar6 = (eval_error *)__cxa_allocate_exception(0x90);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"Error, cannot assign to constant value.",
               (allocator<char> *)(local_90 + 8));
    exception::eval_error::eval_error(peVar6,&local_d0);
    __cxa_throw(peVar6,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
  }
  t_oper = *(Opers *)&t_ss[3].m_stack_holder._M_data;
  if (t_oper == invalid) {
LAB_003d7ba0:
    bVar5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &t_ss->m_conversions,":=");
    if (!bVar5) {
      local_d0._M_string_length = (size_type)local_90;
      t_name._M_str = &((t_ss->m_conversions).m_saves._M_data)->enabled;
      t_name._M_len = (size_t)(in_RDX->m_engine)._M_data;
      local_d0._M_dataplus._M_p = (pointer)&local_b0;
      chaiscript::detail::Dispatch_Engine::call_function
                ((Dispatch_Engine *)this,t_name,
                 (atomic_uint_fast32_t *)(t_ss->m_conversions).m_conversions._M_data,
                 (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)&local_d0);
      goto LAB_003d7ce9;
    }
    if ((*(uint *)(((local_b0.m_engine._M_data)->m_mutex)._M_impl._M_rwlock.__size + 0x10) & 0x20)
        == 0) {
      bVar5 = Type_Info::operator==
                        ((Type_Info *)local_b0.m_engine._M_data,
                         (Type_Info *)local_b0.m_conversions.m_conversions._M_data);
      if (!bVar5) {
        peVar6 = (eval_error *)__cxa_allocate_exception(0x90);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d0,"Mismatched types in equation",
                   (allocator<char> *)(local_90 + 8));
        exception::eval_error::eval_error(peVar6,&local_d0);
        __cxa_throw(peVar6,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
    }
    Boxed_Value::assign(&local_50,(Boxed_Value *)&local_b0);
    pBVar4 = &local_50;
LAB_003d7bf9:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(pBVar4->m_data).
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ((local_b0.m_engine._M_data)->m_conversions).m_mutex._M_impl._M_rwlock.__size[1] = '\0';
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
               &local_b0.m_conversions);
  }
  else {
    if (((uVar1 & 0x10) != 0) &&
       ((*(uint *)(((local_b0.m_conversions.m_conversions._M_data)->m_mutex)._M_impl._M_rwlock.
                   __size + 0x10) & 0x10) != 0)) {
      Boxed_Number::oper((Boxed_Number *)this,t_oper,(Boxed_Value *)&local_b0,
                         (Boxed_Value *)&local_b0.m_conversions);
      goto LAB_003d7ce9;
    }
    if (t_oper != assign) goto LAB_003d7ba0;
    if ((uVar1 & 0x20) != 0) {
      pTVar2 = t_ss[2].m_conversions.m_conversions._M_data;
      if ((pTVar2 != (Type_Conversions *)t_ss[2].m_conversions.m_saves._M_data) &&
         ((lVar3 = (pTVar2->m_mutex)._M_impl._M_rwlock.__align, *(int *)(lVar3 + 8) == 0x22 ||
          ((*(long **)(lVar3 + 0x50) != *(long **)(lVar3 + 0x58) &&
           (*(int *)(**(long **)(lVar3 + 0x50) + 8) == 0x22)))))) {
        Boxed_Value::assign(&local_40,(Boxed_Value *)&local_b0);
        pBVar4 = &local_40;
        goto LAB_003d7bf9;
      }
      local_68.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_b0.m_conversions.m_conversions._M_data;
      local_68.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0.m_conversions.m_saves._M_data;
      local_b0.m_conversions.m_conversions._M_data = (Type_Conversions *)0x0;
      local_b0.m_conversions.m_saves._M_data = (Conversion_Saves *)0x0;
      detail::clone_if_necessary
                ((detail *)&local_d0,&local_68,
                 (atomic_uint_fast32_t *)&t_ss[3].m_conversions.m_saves,in_RDX);
      std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_b0.m_conversions,
                 (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d0._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_68.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    local_d0._M_string_length = (size_type)local_90;
    t_name_00._M_str = &((t_ss->m_conversions).m_saves._M_data)->enabled;
    t_name_00._M_len = (size_t)(in_RDX->m_engine)._M_data;
    local_d0._M_dataplus._M_p = (pointer)&local_b0;
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)this,t_name_00,
               (atomic_uint_fast32_t *)(t_ss->m_conversions).m_conversions._M_data,
               (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)&local_d0);
  }
LAB_003d7ce9:
  std::array<chaiscript::Boxed_Value,_2UL>::~array((array<chaiscript::Boxed_Value,_2UL> *)&local_b0)
  ;
  detail::Function_Push_Pop::~Function_Push_Pop((Function_Push_Pop *)local_90);
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar7.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);

        auto params = [&]() {
          // The RHS *must* be evaluated before the LHS
          // consider `var range = range(x)`
          // if we declare the variable in scope first, then the name lookup fails
          // for the RHS
          auto rhs = this->children[1]->eval(t_ss);
          auto lhs = this->children[0]->eval(t_ss);
          std::array<Boxed_Value, 2> p{std::move(lhs), std::move(rhs)};
          return p;
        }();

        if (params[0].is_return_value()) {
          throw exception::eval_error("Error, cannot assign to temporary value.");
        } else if (params[0].is_const()) {
          throw exception::eval_error("Error, cannot assign to constant value.");
        }

        if (m_oper != Operators::Opers::invalid && params[0].get_type_info().is_arithmetic() && params[1].get_type_info().is_arithmetic()) {
          try {
            return Boxed_Number::do_oper(m_oper, params[0], params[1]);
          } catch (const std::exception &) {
            throw exception::eval_error("Error with unsupported arithmetic assignment operation.");
          }
        } else if (m_oper == Operators::Opers::assign) {
          try {
            if (params[0].is_undef()) {
              if (!this->children.empty()
                  && ((this->children[0]->identifier == AST_Node_Type::Reference)
                      || (!this->children[0]->children.empty() && this->children[0]->children[0]->identifier == AST_Node_Type::Reference)))

              {
                /// \todo This does not handle the case of an unassigned reference variable
                ///       being assigned outside of its declaration
                params[0].assign(params[1]);
                params[0].reset_return_value();
                return params[1];
              } else {
                params[1] = detail::clone_if_necessary(std::move(params[1]), m_clone_loc, t_ss);
              }
            }

            try {
              return t_ss->call_function(this->text, m_loc, Function_Params{params}, t_ss.conversions());
            } catch (const exception::dispatch_error &e) {
              throw exception::eval_error("Unable to find appropriate'" + this->text + "' operator.", e.parameters, e.functions, false, *t_ss);
            }
          } catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Missing clone or copy constructor for right hand side of equation",
                                        e.parameters,
                                        e.functions,
                                        false,
                                        *t_ss);
          }
        } else if (this->text == ":=") {
          if (params[0].is_undef() || Boxed_Value::type_match(params[0], params[1])) {
            params[0].assign(params[1]);
            params[0].reset_return_value();
          } else {
            throw exception::eval_error("Mismatched types in equation");
          }
        } else {
          try {
            return t_ss->call_function(this->text, m_loc, Function_Params{params}, t_ss.conversions());
          } catch (const exception::dispatch_error &e) {
            throw exception::eval_error("Unable to find appropriate'" + this->text + "' operator.", e.parameters, e.functions, false, *t_ss);
          }
        }

        return params[1];
      }